

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstate.cc
# Opt level: O1

void __thiscall re2::BitState::Push(BitState *this,int id,char *p,int arg)

{
  int iVar1;
  uint uVar2;
  Job *pJVar3;
  bool bVar4;
  char *pcVar5;
  
  if ((this->maxjob_ <= this->njob_) && (bVar4 = GrowStack(this), !bVar4)) {
    return;
  }
  if ((~this->prog_->inst_[id].out_opcode_ & 7) != 0) {
    if (arg == 0) {
      pcVar5 = p + (((long)(this->text_).length_ + 1) * (long)id - (long)(this->text_).ptr_);
      uVar2 = this->visited_[(ulong)pcVar5 >> 5];
      if ((uVar2 >> ((uint)pcVar5 & 0x1f) & 1) != 0) {
        return;
      }
      this->visited_[(ulong)pcVar5 >> 5] = 1 << ((byte)pcVar5 & 0x1f) | uVar2;
    }
    pJVar3 = this->job_;
    iVar1 = this->njob_;
    this->njob_ = iVar1 + 1;
    pJVar3[iVar1].id = id;
    pJVar3[iVar1].p = p;
    pJVar3[iVar1].arg = arg;
  }
  return;
}

Assistant:

void BitState::Push(int id, const char* p, int arg) {
  if (njob_ >= maxjob_) {
    if (!GrowStack())
      return;
  }
  int op = prog_->inst(id)->opcode();
  if (op == kInstFail)
    return;

  // Only check ShouldVisit when arg == 0.
  // When arg > 0, we are continuing a previous visit.
  if (arg == 0 && !ShouldVisit(id, p))
    return;

  Job* j = &job_[njob_++];
  j->id = id;
  j->p = p;
  j->arg = arg;
}